

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ReturnCallIndirectExpr::~ReturnCallIndirectExpr(ReturnCallIndirectExpr *this)

{
  (this->super_ExprMixin<(wabt::ExprType)33>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__ReturnCallIndirectExpr_013e23c8;
  FuncDeclaration::~FuncDeclaration(&this->decl);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location &loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}